

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

panel * get_panel_misc(void)

{
  panel *p;
  
  p = panel_allocate(L'\a');
  panel_line(p,'\x0e',"Age","%d",(ulong)(uint)(int)player->age);
  panel_line(p,'\x0e',"Height","%d\'%d\"",(ulong)(uint)(int)(player->ht / 0xc),
             (ulong)(uint)(int)(player->ht % 0xc));
  panel_line(p,'\x0e',"Weight","%dst %dlb",(ulong)(uint)(int)(player->wt / 0xe),
             (ulong)(uint)(int)(player->wt % 0xe));
  panel_line(p,'\x0e',"Turns used:","");
  panel_line(p,'\x0e',"Game","%d",(ulong)(uint)turn);
  panel_line(p,'\x0e',"Standard","%d",(ulong)player->total_energy / 100);
  panel_line(p,'\x0e',"Resting","%d",(ulong)player->resting_turn);
  return p;
}

Assistant:

static struct panel *get_panel_misc(void) {
	struct panel *p = panel_allocate(7);
	uint8_t attr = COLOUR_L_BLUE;

	panel_line(p, attr, "Age", "%d", player->age);
	panel_line(p, attr, "Height", "%d'%d\"", player->ht / 12, player->ht % 12);
	panel_line(p, attr, "Weight", "%dst %dlb", player->wt / 14, player->wt % 14);
	panel_line(p, attr, "Turns used:", "");
	panel_line(p, attr, "Game", "%d", turn);
	panel_line(p, attr, "Standard", "%d", player->total_energy / 100);
	panel_line(p, attr, "Resting", "%d", player->resting_turn);

	return p;
}